

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O3

longlong get_big_int(FMFieldPtr field,void *data)

{
  undefined1 uVar1;
  ushort uVar2;
  FMdata_type FVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long_long uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  int i;
  void *in_RDX;
  long lVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  longdouble in_ST0;
  long tmp;
  longlong local_18 [2];
  
  FVar3 = field->data_type;
  if (FVar3 == float_type) {
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    local_18[0] = (longlong)in_ST0;
  }
  else {
    if (FVar3 == unsigned_type) {
      uVar7 = get_big_unsigned(field,data);
      return uVar7;
    }
    if (FVar3 != integer_type) {
      get_big_int_cold_2();
      uVar7 = get_big_unsigned(field,data);
      return uVar7;
    }
    switch(field->size) {
    case 1:
      local_18[0] = (longlong)*(char *)((long)data + field->offset);
      break;
    case 2:
      uVar2 = *(ushort *)((long)data + field->offset);
      uVar4 = uVar2 >> 8;
      if (field->byte_swap == '\0') {
        uVar4 = uVar2;
        uVar2 = uVar2 >> 8;
      }
      local_18[0] = (longlong)(short)(uVar4 & 0xff | uVar2 << 8);
      break;
    case 4:
      uVar6 = *(uint *)((long)data + field->offset);
      uVar14 = uVar6 >> 8;
      uVar8 = uVar6 >> 0x10;
      uVar5 = uVar6 >> 0x18;
      uVar9 = uVar14;
      if (field->byte_swap != '\0') {
        uVar13 = uVar6 & 0xff;
        uVar9 = uVar8;
        uVar6 = uVar5;
        uVar5 = uVar13;
        uVar8 = uVar14;
      }
      local_18[0] = (longlong)
                    (int)(uVar6 & 0xff |
                         (uVar9 & 0xff) << 8 | (uVar8 & 0xff) << 0x10 | uVar5 << 0x18);
      break;
    case 8:
      local_18[0] = *(longlong *)((long)data + field->offset);
      if (field->byte_swap != '\0') {
        uVar11 = 0x700000000;
        lVar12 = 0;
        do {
          uVar1 = *(undefined1 *)((long)local_18 + lVar12);
          *(undefined1 *)((long)local_18 + lVar12) =
               *(undefined1 *)((long)local_18 + (uVar11 >> 0x20));
          *(undefined1 *)((long)local_18 + (uVar11 >> 0x20)) = uVar1;
          lVar12 = lVar12 + 1;
          uVar11 = uVar11 - 0x100000000;
        } while (lVar12 != 4);
      }
      break;
    default:
      if (field->size == 0x10) {
        bVar15 = field->byte_swap == '\0';
        sVar10 = field->offset + 8;
        if (bVar15) {
          sVar10 = field->offset;
        }
        local_18[0] = *(longlong *)((long)data + sVar10);
        if (bVar15) {
          return *(longlong *)((long)data + sVar10);
        }
        uVar11 = 0x700000000;
        lVar12 = 0;
        do {
          uVar1 = *(undefined1 *)((long)local_18 + lVar12);
          *(undefined1 *)((long)local_18 + lVar12) =
               *(undefined1 *)((long)local_18 + (uVar11 >> 0x20));
          *(undefined1 *)((long)local_18 + (uVar11 >> 0x20)) = uVar1;
          lVar12 = lVar12 + 1;
          uVar11 = uVar11 - 0x100000000;
        } while (lVar12 != 4);
        return local_18[0];
      }
    case 3:
    case 5:
    case 6:
    case 7:
      local_18[0] = -1;
      if (get_long_warn == 0) {
        get_big_int_cold_1();
      }
    }
  }
  return local_18[0];
}

Assistant:

static MAX_INTEGER_TYPE
get_big_int(FMFieldPtr field, void *data)
{
    if (field->data_type == integer_type) {
	if (field->size == sizeof(char)) {
	    char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (long) tmp;
	} else if (field->size == sizeof(short)) {
	    short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(short));
	    return (long) tmp;
	} else if (field->size == sizeof(int)) {
	    int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(int));
	    return (long) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return -1;
	}
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_INTEGER_TYPE) (long) (double) tmp;
#else
	return (MAX_INTEGER_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOlong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}